

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5Fts5Func(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  void *pvVar1;
  undefined8 *puVar2;
  fts5_api **ppApi;
  Fts5Global *pGlobal;
  sqlite3_value **apArg_local;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  pvVar1 = sqlite3_user_data(pCtx);
  puVar2 = (undefined8 *)sqlite3_value_pointer(*apArg,"fts5_api_ptr");
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = pvVar1;
  }
  return;
}

Assistant:

static void fts5Fts5Func(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apArg           /* Function arguments */
){
  Fts5Global *pGlobal = (Fts5Global*)sqlite3_user_data(pCtx);
  fts5_api **ppApi;
  UNUSED_PARAM(nArg);
  assert( nArg==1 );
  ppApi = (fts5_api**)sqlite3_value_pointer(apArg[0], "fts5_api_ptr");
  if( ppApi ) *ppApi = &pGlobal->api;
}